

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O2

void __thiscall
testing::internal::MaxBipartiteMatchState::MaxBipartiteMatchState
          (MaxBipartiteMatchState *this,MatchMatrix *graph)

{
  allocator_type local_12;
  allocator_type local_11;
  
  this->graph_ = graph;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->left_,*(size_type *)graph,&kUnused,&local_11);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->right_,*(size_type *)(this->graph_ + 8),&kUnused,&local_12);
  return;
}

Assistant:

explicit MaxBipartiteMatchState(const MatchMatrix& graph)
      : graph_(&graph),
        left_(graph_->LhsSize(), kUnused),
        right_(graph_->RhsSize(), kUnused) {}